

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O0

void __thiscall
CLIntercept::getMDAPICountersFromEvent(CLIntercept *this,string *name,cl_event event)

{
  uint32_t uVar1;
  SConfig *pSVar2;
  cl_icd_dispatch *pcVar3;
  cl_event in_RDX;
  CLIntercept *in_RDI;
  float __x;
  cl_command_type type;
  uint32_t numResults;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  ioInfoValues;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  maxValues;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  results;
  cl_int errorCode;
  size_t outputSize;
  char *pReport;
  size_t reportSize;
  MDHelper *in_stack_ffffffffffffff10;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_ffffffffffffff20;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  cl_int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int iVar4;
  undefined4 in_stack_ffffffffffffff6c;
  MDHelper *in_stack_ffffffffffffff70;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_ffffffffffffff80;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_ffffffffffffff88;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffffa4;
  MDHelper *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  CMetricAggregations *in_stack_ffffffffffffffb8;
  MDHelper *in_stack_ffffffffffffffc0;
  bool local_35;
  cl_int local_34;
  size_t local_30;
  void *local_28;
  ulong local_20;
  cl_event local_18;
  
  local_18 = in_RDX;
  pSVar2 = config(in_RDI);
  std::_Swallow_assign::operator=
            ((_Swallow_assign *)&std::ignore,&pSVar2->DevicePerfCounterEventBasedSampling);
  if (in_RDI->m_pMDHelper != (MDHelper *)0x0) {
    uVar1 = MetricsDiscovery::MDHelper::GetQueryReportSize(in_stack_ffffffffffffff10);
    local_20 = (ulong)uVar1;
    local_28 = operator_new__(local_20);
    if (local_28 != (void *)0x0) {
      local_30 = 0;
      pcVar3 = dispatch(in_RDI);
      local_34 = (*pcVar3->clGetEventProfilingInfo)(local_18,0x407f,local_20,local_28,&local_30);
      if (local_34 == 0) {
        local_35 = local_30 == local_20;
        std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_35);
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::vector((vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                  *)0x272f23);
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::vector((vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                  *)0x272f35);
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::vector((vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                  *)0x272f3f);
        uVar1 = MetricsDiscovery::MDHelper::GetMetricsFromReports
                          (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                           in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88);
        if (uVar1 != 0) {
          MetricsDiscovery::MDHelper::PrintMetricValues
                    (in_stack_ffffffffffffff70,
                     (ostream *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                     (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff80);
          MetricsDiscovery::MDHelper::AggregateMetrics
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                      *)in_stack_ffffffffffffffa8);
        }
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::~vector(in_stack_ffffffffffffff20);
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::~vector(in_stack_ffffffffffffff20);
        std::
        vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
        ::~vector(in_stack_ffffffffffffff20);
      }
      else {
        iVar4 = 0;
        pcVar3 = dispatch(in_RDI);
        (*pcVar3->clGetEventInfo)(local_18,0x11d1,4,&stack0xffffffffffffff68,(size_t *)0x0);
        if (iVar4 == 0x11f0) {
          enumName(in_RDI);
          CEnumNameMap::name_abi_cxx11_
                    ((CEnumNameMap *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff54);
          __x = (float)std::__cxx11::string::c_str();
          logf(in_RDI,__x);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
        }
      }
      if (local_28 != (void *)0x0) {
        operator_delete__(local_28);
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::getMDAPICountersFromEvent(
    const std::string& name,
    const cl_event event )
{
    // We should only get here when event based sampling is enabled.
    CLI_ASSERT( config().DevicePerfCounterEventBasedSampling );

    if( m_pMDHelper )
    {
        const size_t reportSize = m_pMDHelper->GetQueryReportSize();

        char*   pReport = new char[ reportSize ];
        if( pReport )
        {
            size_t  outputSize = 0;
            cl_int  errorCode = dispatch().clGetEventProfilingInfo(
                event,
                CL_PROFILING_COMMAND_PERFCOUNTERS_INTEL,
                reportSize,
                pReport,
                &outputSize );

            if( errorCode == CL_SUCCESS )
            {
                // Check: The size of the queried report should be the expected size.
                CLI_ASSERT( outputSize == reportSize );

                std::vector<MetricsDiscovery::TTypedValue_1_0> results;
                std::vector<MetricsDiscovery::TTypedValue_1_0> maxValues;
                std::vector<MetricsDiscovery::TTypedValue_1_0> ioInfoValues; // unused

                uint32_t numResults = m_pMDHelper->GetMetricsFromReports(
                    1,
                    pReport,
                    results,
                    maxValues );

                if( numResults )
                {
                    m_pMDHelper->PrintMetricValues(
                        m_MetricDump,
                        name,
                        numResults,
                        results,
                        maxValues,
                        ioInfoValues );
                    m_pMDHelper->AggregateMetrics(
                        m_MetricAggregations,
                        name,
                        results );
                }
            }
            else
            {
                // Currently, MDAPI data is only included for kernels, so only
                // report an errors for kernel events.
                cl_command_type type = 0;
                dispatch().clGetEventInfo(
                    event,
                    CL_EVENT_COMMAND_TYPE,
                    sizeof(type),
                    &type,
                    NULL );
                if( type == CL_COMMAND_NDRANGE_KERNEL )
                {
                    logf("Couldn't get MDAPI data for kernel!  clGetEventProfilingInfo returned '%s' (%08X)!\n",
                        enumName().name(errorCode).c_str(),
                        errorCode );
                }
            }

            delete [] pReport;
            pReport = NULL;
        }
    }
}